

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O2

void SEM_CompSt(ast *node,field_t *f)

{
  attr *a;
  ast *paVar1;
  int n;
  char *s;
  
  do {
    if (f == (field_t *)0x0) {
      paVar1 = child(node,2);
      SEM_DefList(paVar1,1);
      n = 3;
      while( true ) {
        node = child(node,n);
        if (node->type == -1) break;
        paVar1 = child(node,1);
        SEM_Stmt(paVar1);
        n = 2;
      }
      return;
    }
    a = f->type;
    if (a->kind == 2) {
      a = findvar(((a->field_1).basic)->name);
      if (a != (attr *)0x0) {
        s = f->name;
        goto LAB_00107719;
      }
      semerror(0x11,node->pos->first_line,semErrorMsg[0x11],*_DAT_00000008);
    }
    else {
      s = f->name;
LAB_00107719:
      insertvar(s,a);
    }
    f = f->next;
  } while( true );
}

Assistant:

static void SEM_CompSt(struct ast *node, struct field_t *f) {
#if COMPILER_VERSION < 3
    newenv();
#endif
    for (; f; f = f->next) {
        struct attr *a = f->type;
        if (a->kind == STRUCTURE) {
            a = findvar(a->structure->name);
            if (a == NULL) {
                SEMERROR(UndefinedStruct, node, a->structure->name);
            } else
                insertvar(f->name, a);
        } else
            insertvar(f->name, f->type);
    }
    SEM_DefList(child(node, 2), 1);
    SEM_StmtList(child(node ,3));
#if COMPILER_VERSION < 3
    deleteenv();
#endif
}